

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void print_node(c2m_ctx_t c2m_ctx,FILE *f,node_t_conflict n,int indent,int attr_p)

{
  node_code_t nVar1;
  node_t pnVar2;
  void *pvVar3;
  code *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  code *pcVar8;
  int iVar9;
  bool bVar10;
  pos_t pVar11;
  
  fprintf((FILE *)f,"%6u: ",(ulong)n->uid);
  iVar9 = indent;
  if (0 < indent) {
    do {
      fputc(0x20,(FILE *)f);
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  if (n == &err_struct) {
    fwrite("<error>\n",8,1,(FILE *)f);
    return;
  }
  if (0x80 < (ulong)n->code) {
switchD_00174de3_default:
    abort();
  }
  fprintf((FILE *)f,"%s (",&DAT_001bc7a4 + *(int *)(&DAT_001bc7a4 + (ulong)n->code * 4));
  pVar11 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)n->uid);
  if (-1 < pVar11.lno) {
    fprintf((FILE *)f,"%s:%d",pVar11.fname);
  }
  fputc(0x29,(FILE *)f);
  nVar1 = n->code;
  switch(nVar1) {
  case N_IGNORE:
    goto switchD_00174de3_caseD_0;
  case N_I:
    pcVar6 = (n->u).s.s;
    pcVar7 = " %lld";
    break;
  case N_L:
    pcVar6 = (n->u).s.s;
    pcVar7 = " %lldl";
    break;
  case N_LL:
    pcVar6 = (n->u).s.s;
    pcVar7 = " %lldll";
    break;
  case N_U:
    pcVar6 = (n->u).s.s;
    pcVar7 = " %lluu";
    break;
  case N_UL:
    pcVar6 = (n->u).s.s;
    pcVar7 = " %lluul";
    break;
  case N_ULL:
    pcVar6 = (n->u).s.s;
    pcVar7 = " %lluull";
    break;
  case N_F:
    pcVar6 = (char *)(double)(n->u).f;
    uVar5 = 0x18;
    goto LAB_001751fc;
  case N_D:
    pcVar6 = (n->u).s.s;
    uVar5 = 0x35;
LAB_001751fc:
    fprintf((FILE *)f," %.*g",pcVar6,uVar5);
    goto LAB_00175203;
  case N_LD:
    fprintf((FILE *)f," %.*Lg",0x40);
    goto LAB_00175203;
  case N_CH:
  case N_CH16:
  case N_CH32:
    pcVar6 = "U";
    if (nVar1 == N_CH16) {
      pcVar6 = "u";
    }
    pcVar7 = "";
    if (nVar1 != N_CH) {
      pcVar7 = pcVar6;
    }
    fprintf((FILE *)f," %s\'",pcVar7);
    print_char(f,(long)(n->u).ch);
    iVar9 = 0x27;
    goto LAB_00174f70;
  case N_STR:
  case N_STR16:
  case N_STR32:
    pcVar6 = "U";
    if (nVar1 == N_STR16) {
      pcVar6 = "u";
    }
    pcVar7 = "";
    if (nVar1 != N_STR) {
      pcVar7 = pcVar6;
    }
    fprintf((FILE *)f," %s\"",pcVar7);
    pcVar4 = print_chars32;
    if (n->code == N_STR16) {
      pcVar4 = print_chars16;
    }
    pcVar8 = print_chars;
    if (n->code != N_STR) {
      pcVar8 = pcVar4;
    }
    (*pcVar8)(f,(n->u).s.s,(n->u).s.len);
    iVar9 = 0x22;
LAB_00174f70:
    fputc(iVar9,(FILE *)f);
    goto LAB_00175203;
  case N_ID:
    pcVar6 = (n->u).s.s;
    pcVar7 = " %s";
    break;
  case N_COMMA:
  case N_ANDAND:
  case N_OROR:
  case N_STMTEXPR:
  case N_EQ:
  case N_NE:
  case N_LT:
  case N_LE:
  case N_GT:
  case N_GE:
  case N_ASSIGN:
  case N_BITWISE_NOT:
  case N_NOT:
  case N_AND:
  case N_AND_ASSIGN:
  case N_OR:
  case N_OR_ASSIGN:
  case N_XOR:
  case N_XOR_ASSIGN:
  case N_LSH:
  case N_LSH_ASSIGN:
  case N_RSH:
  case N_RSH_ASSIGN:
  case N_ADD:
  case N_ADD_ASSIGN:
  case N_SUB:
  case N_SUB_ASSIGN:
  case N_MUL:
  case N_MUL_ASSIGN:
  case N_DIV:
  case N_DIV_ASSIGN:
  case N_MOD:
  case N_MOD_ASSIGN:
  case N_IND:
  case N_FIELD:
  case N_ADDR:
  case N_DEREF:
  case N_DEREF_FIELD:
  case N_COND:
  case N_INC:
  case N_DEC:
  case N_POST_INC:
  case N_POST_DEC:
  case N_ALIGNOF:
  case N_SIZEOF:
  case N_EXPR_SIZEOF:
  case N_CAST:
  case N_COMPOUND_LITERAL:
  case N_CALL:
  case N_GENERIC:
  case N_LABEL_ADDR:
    if ((attr_p != 0) && ((expr_conflict *)n->attr != (expr_conflict *)0x0)) {
      print_expr(c2m_ctx,f,(expr_conflict *)n->attr);
    }
  case N_GENERIC_ASSOC:
  case N_IF:
  case N_WHILE:
  case N_DO:
  case N_CONTINUE:
  case N_BREAK:
  case N_RETURN:
  case N_EXPR:
  case N_CASE:
  case N_DEFAULT:
  case N_LABEL:
  case N_SHARE:
  case N_TYPEDEF:
  case N_EXTERN:
  case N_STATIC:
  case N_AUTO:
  case N_REGISTER:
  case N_THREAD_LOCAL:
  case N_DECL:
  case N_VOID:
  case N_CHAR:
  case N_SHORT:
  case N_INT:
  case N_LONG:
  case N_FLOAT:
  case N_DOUBLE:
  case N_SIGNED:
  case N_UNSIGNED:
  case N_BOOL:
  case N_CONST:
  case N_RESTRICT:
  case N_VOLATILE:
  case N_ATOMIC:
  case N_INLINE:
  case N_NO_RETURN:
  case N_ALIGNAS:
  case N_STAR:
  case N_POINTER:
  case N_DOTS:
  case N_ARR:
  case N_INIT:
  case N_FIELD_ID:
  case N_TYPE:
  case N_ST_ASSERT:
  case N_ASM:
  case N_ATTR:
    goto switchD_00174de3_caseD_43;
  case N_SWITCH:
    if ((attr_p != 0) && (n->attr != (void *)0x0)) {
      fwrite(": ",2,1,(FILE *)f);
      print_type(c2m_ctx,f,(type *)n->attr);
    }
    goto switchD_00174de3_caseD_43;
  case N_FOR:
  case N_BLOCK:
  case N_STRUCT:
  case N_UNION:
  case N_MODULE:
    bVar10 = attr_p == 0;
    if (bVar10) {
LAB_00174e84:
      fputc(10,(FILE *)f);
    }
    else {
      if ((nVar1 & ~N_I) == N_STRUCT) {
        pnVar2 = (n->u).ops.head;
        if (((pnVar2 == (node_t)0x0) || (pnVar2 = (pnVar2->op_link).next, pnVar2 == (node_t)0x0)) ||
           (pnVar2->code == N_IGNORE)) goto LAB_00174e84;
LAB_00174f9d:
        pvVar3 = n->attr;
        if (pvVar3 != (void *)0x0) goto LAB_00175134;
      }
      else {
        if (nVar1 != N_MODULE) goto LAB_00174f9d;
        fwrite(": the top scope",0xf,1,(FILE *)f);
      }
      bVar10 = false;
    }
    goto LAB_0017514f;
  case N_GOTO:
    if ((attr_p != 0) && (n->attr != (void *)0x0)) {
      fprintf((FILE *)f,": target node %u\n",(ulong)*(uint *)((long)n->attr + 4));
    }
  case N_INDIRECT_GOTO:
    goto switchD_00174de3_caseD_4a;
  case N_LIST:
    if ((attr_p != 0) && (n->attr != (void *)0x0)) {
      fwrite(": ",2,1,(FILE *)f);
      print_decl_spec(c2m_ctx,f,(decl_spec *)n->attr);
    }
    goto switchD_00174de3_caseD_43;
  case N_SPEC_DECL:
  case N_MEMBER:
  case N_FUNC_DEF:
    if ((attr_p != 0) && ((decl_t)n->attr != (decl_t)0x0)) {
      print_decl(c2m_ctx,f,(decl_t)n->attr);
    }
switchD_00174de3_caseD_43:
    fputc(10,(FILE *)f);
    goto switchD_00174de3_caseD_4a;
  case N_ENUM:
    if ((attr_p != 0) && (n->attr != (void *)0x0)) {
      fwrite(": enum_basic_type = ",0x14,1,(FILE *)f);
      print_basic_type(f,*n->attr);
      goto switchD_00174de3_caseD_43;
    }
    goto switchD_00174de3_caseD_4a;
  case N_ENUM_CONST:
    if ((attr_p != 0) && ((undefined8 *)n->attr != (undefined8 *)0x0)) {
      fprintf((FILE *)f,": val = %lld\n",*n->attr);
    }
    goto switchD_00174de3_caseD_4a;
  case N_FUNC:
    if (attr_p == 0) {
      fputc(10,(FILE *)f);
      attr_p = 0;
      goto LAB_00174e19;
    }
    pvVar3 = n->attr;
    if (pvVar3 == (void *)0x0) {
      fputc(10,(FILE *)f);
      attr_p = 1;
      goto LAB_00174e19;
    }
LAB_00175134:
    bVar10 = false;
    fprintf((FILE *)f,": higher scope node %u",(ulong)*(uint *)(*(long *)((long)pvVar3 + 0x20) + 4))
    ;
LAB_0017514f:
    if ((n->code & ~N_I) == N_STRUCT) goto switchD_00174de3_caseD_43;
    if ((!bVar10) && (pvVar3 = n->attr, pvVar3 != (void *)0x0)) {
      fprintf((FILE *)f,", size = %llu, offset = %llu\n",*(undefined8 *)((long)pvVar3 + 8),
              *(undefined8 *)((long)pvVar3 + 0x10));
    }
switchD_00174de3_caseD_4a:
LAB_00174e19:
    print_ops(c2m_ctx,f,n,indent,attr_p);
    return;
  default:
    goto switchD_00174de3_default;
  }
  fprintf((FILE *)f,pcVar7,pcVar6);
LAB_00175203:
  if ((attr_p != 0) && ((expr_conflict *)n->attr != (expr_conflict *)0x0)) {
    print_expr(c2m_ctx,f,(expr_conflict *)n->attr);
  }
switchD_00174de3_caseD_0:
  fputc(10,(FILE *)f);
  return;
}

Assistant:

static void print_node (c2m_ctx_t c2m_ctx, FILE *f, node_t n, int indent, int attr_p) {
  int i;

  fprintf (f, "%6u: ", n->uid);
  for (i = 0; i < indent; i++) fprintf (f, " ");
  if (n == err_node) {
    fprintf (f, "<error>\n");
    return;
  }
  fprintf (f, "%s (", get_node_name (n->code));
  print_pos (f, POS (n), FALSE);
  fprintf (f, ")");
  switch (n->code) {
  case N_IGNORE: fprintf (f, "\n"); break;
  case N_I: fprintf (f, " %lld", (long long) n->u.l); goto expr;
  case N_L: fprintf (f, " %lldl", (long long) n->u.l); goto expr;
  case N_LL: fprintf (f, " %lldll", (long long) n->u.ll); goto expr;
  case N_U: fprintf (f, " %lluu", (unsigned long long) n->u.ul); goto expr;
  case N_UL: fprintf (f, " %lluul", (unsigned long long) n->u.ul); goto expr;
  case N_ULL: fprintf (f, " %lluull", (unsigned long long) n->u.ull); goto expr;
  case N_F: fprintf (f, " %.*g", FLT_MANT_DIG, (double) n->u.f); goto expr;
  case N_D: fprintf (f, " %.*g", DBL_MANT_DIG, (double) n->u.d); goto expr;
  case N_LD: fprintf (f, " %.*Lg", LDBL_MANT_DIG, (long double) n->u.ld); goto expr;
  case N_CH:
  case N_CH16:
  case N_CH32:
    fprintf (f, " %s'", n->code == N_CH ? "" : n->code == N_CH16 ? "u" : "U");
    print_char (f, n->u.ch);
    fprintf (f, "'");
    goto expr;
  case N_STR:
  case N_STR16:
  case N_STR32:
    fprintf (f, " %s\"", n->code == N_STR ? "" : n->code == N_STR16 ? "u" : "U");
    (n->code == N_STR     ? print_chars
     : n->code == N_STR16 ? print_chars16
                          : print_chars32) (f, n->u.s.s, n->u.s.len);
    fprintf (f, "\"");
    goto expr;
  case N_ID:
    fprintf (f, " %s", n->u.s.s);
  expr:
    if (attr_p && n->attr != NULL) print_expr (c2m_ctx, f, n->attr);
    fprintf (f, "\n");
    break;
  case N_COMMA:
  case N_ANDAND:
  case N_OROR:
  case N_EQ:
  case N_NE:
  case N_LT:
  case N_LE:
  case N_GT:
  case N_GE:
  case N_ASSIGN:
  case N_BITWISE_NOT:
  case N_NOT:
  case N_AND:
  case N_AND_ASSIGN:
  case N_OR:
  case N_OR_ASSIGN:
  case N_XOR:
  case N_XOR_ASSIGN:
  case N_LSH:
  case N_LSH_ASSIGN:
  case N_RSH:
  case N_RSH_ASSIGN:
  case N_ADD:
  case N_ADD_ASSIGN:
  case N_SUB:
  case N_SUB_ASSIGN:
  case N_MUL:
  case N_MUL_ASSIGN:
  case N_DIV:
  case N_DIV_ASSIGN:
  case N_MOD:
  case N_MOD_ASSIGN:
  case N_IND:
  case N_FIELD:
  case N_ADDR:
  case N_DEREF:
  case N_DEREF_FIELD:
  case N_COND:
  case N_INC:
  case N_DEC:
  case N_POST_INC:
  case N_POST_DEC:
  case N_ALIGNOF:
  case N_SIZEOF:
  case N_EXPR_SIZEOF:
  case N_CAST:
  case N_COMPOUND_LITERAL:
  case N_CALL:
  case N_GENERIC:
  case N_STMTEXPR:
  case N_LABEL_ADDR:
    if (attr_p && n->attr != NULL) print_expr (c2m_ctx, f, n->attr);
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_GENERIC_ASSOC:
  case N_IF:
  case N_WHILE:
  case N_DO:
  case N_CONTINUE:
  case N_BREAK:
  case N_RETURN:
  case N_EXPR:
  case N_CASE:
  case N_DEFAULT:
  case N_LABEL:
  case N_SHARE:
  case N_TYPEDEF:
  case N_EXTERN:
  case N_STATIC:
  case N_AUTO:
  case N_REGISTER:
  case N_THREAD_LOCAL:
  case N_DECL:
  case N_VOID:
  case N_CHAR:
  case N_SHORT:
  case N_INT:
  case N_LONG:
  case N_FLOAT:
  case N_DOUBLE:
  case N_SIGNED:
  case N_UNSIGNED:
  case N_BOOL:
  case N_CONST:
  case N_RESTRICT:
  case N_VOLATILE:
  case N_ATOMIC:
  case N_INLINE:
  case N_NO_RETURN:
  case N_ALIGNAS:
  case N_STAR:
  case N_POINTER:
  case N_DOTS:
  case N_ARR:
  case N_INIT:
  case N_FIELD_ID:
  case N_TYPE:
  case N_ST_ASSERT:
  case N_ASM:
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_ATTR:
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_LIST:
    if (attr_p && n->attr != NULL) {
      fprintf (f, ": ");
      print_decl_spec (c2m_ctx, f, (struct decl_spec *) n->attr);
    }
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_SPEC_DECL:
  case N_MEMBER:
  case N_FUNC_DEF:
    if (attr_p && n->attr != NULL) print_decl (c2m_ctx, f, (decl_t) n->attr);
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_FUNC:
    if (!attr_p || n->attr == NULL) {
      fprintf (f, "\n");
      print_ops (c2m_ctx, f, n, indent, attr_p);
      break;
    }
    /* fall through */
  case N_STRUCT:
  case N_UNION:
  case N_MODULE:
  case N_BLOCK:
  case N_FOR:
    if (!attr_p
        || ((n->code == N_STRUCT || n->code == N_UNION)
            && (NL_EL (n->u.ops, 1) == NULL || NL_EL (n->u.ops, 1)->code == N_IGNORE)))
      fprintf (f, "\n");
    else if (n->code == N_MODULE)
      fprintf (f, ": the top scope");
    else if (n->attr != NULL)
      fprintf (f, ": higher scope node %u", ((struct node_scope *) n->attr)->scope->uid);
    if (n->code == N_STRUCT || n->code == N_UNION)
      fprintf (f, "\n");
    else if (attr_p && n->attr != NULL)
      fprintf (f, ", size = %llu, offset = %llu\n",
               (unsigned long long) ((struct node_scope *) n->attr)->size,
               (unsigned long long) ((struct node_scope *) n->attr)->offset);
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_SWITCH:
    if (attr_p && n->attr != NULL) {
      fprintf (f, ": ");
      print_type (c2m_ctx, f, &((struct switch_attr *) n->attr)->type);
    }
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_GOTO:
    if (attr_p && n->attr != NULL) fprintf (f, ": target node %u\n", ((node_t) n->attr)->uid);
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_INDIRECT_GOTO: print_ops (c2m_ctx, f, n, indent, attr_p); break;
  case N_ENUM:
    if (attr_p && n->attr != NULL) {
      fprintf (f, ": enum_basic_type = ");
      print_basic_type (f, ((struct enum_type *) n->attr)->enum_basic_type);
      fprintf (f, "\n");
    }
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_ENUM_CONST:
    if (attr_p && n->attr != NULL)  // ???!!!
      fprintf (f, ": val = %lld\n", (long long) ((struct enum_value *) n->attr)->u.i_val);
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  default: abort ();
  }
}